

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_base.h
# Opt level: O0

PinResult __thiscall
density::detail::PinGuard<density_tests::DeepTestAllocator<65536UL>,_(density::progress_guarantee)0>
::pin(PinGuard<density_tests::DeepTestAllocator<65536UL>,_(density::progress_guarantee)0> *this,
     void *i_address)

{
  bool bVar1;
  void *i_address_00;
  void *page;
  void *i_address_local;
  PinGuard<density_tests::DeepTestAllocator<65536UL>,_(density::progress_guarantee)0> *this_local;
  
  i_address_00 = address_lower_align(i_address,0x10000);
  if (i_address_00 == this->m_pinned_page) {
    this_local._4_4_ = AlreadyPinned;
  }
  else {
    bVar1 = ConstConditional(false);
    if (bVar1) {
      if ((i_address_00 != (void *)0x0) &&
         (bVar1 = density_tests::DeepTestAllocator<65536UL>::try_pin_page
                            (this->m_allocator,progress_wait_free,i_address_00), !bVar1)) {
        return PinFailed;
      }
      if (this->m_pinned_page != (void *)0x0) {
        density_tests::DeepTestAllocator<65536UL>::unpin_page
                  (this->m_allocator,progress_wait_free,this->m_pinned_page);
      }
    }
    else {
      if (i_address_00 != (void *)0x0) {
        density_tests::DeepTestAllocator<65536UL>::pin_page(this->m_allocator,i_address_00);
      }
      if (this->m_pinned_page != (void *)0x0) {
        density_tests::DeepTestAllocator<65536UL>::unpin_page(this->m_allocator,this->m_pinned_page)
        ;
      }
    }
    this->m_pinned_page = i_address_00;
    this_local._4_4_ = PinSuccessfull;
  }
  return this_local._4_4_;
}

Assistant:

PinResult pin(void * i_address) noexcept
            {
                auto const page = address_lower_align(i_address, ALLOCATOR_TYPE::page_alignment);
                if (page == m_pinned_page)
                {
                    return AlreadyPinned;
                }
                if (ConstConditional(PROGRESS_GUARANTEE == progress_wait_free))
                {
                    if (page != nullptr)
                    {
                        if (!m_allocator->try_pin_page(progress_wait_free, page))
                            return PinFailed;
                    }
                    if (m_pinned_page != nullptr)
                        m_allocator->unpin_page(progress_wait_free, m_pinned_page);
                }
                else
                {
                    if (page != nullptr)
                        m_allocator->pin_page(page);
                    if (m_pinned_page != nullptr)
                        m_allocator->unpin_page(m_pinned_page);
                }
                m_pinned_page = page;
                return PinSuccessfull;
            }